

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::ProjectionLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,ProjectionLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Transform *this_00;
  undefined8 uVar1;
  bool bVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  float a;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar11 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar16 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar18 [16];
  Point3<float> PVar19;
  Point3f PVar20;
  Vector3<float> VVar21;
  SampledSpectrum SVar22;
  SampledSpectrum local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_60;
  float local_58;
  Tuple3<pbrt::Point3,_float> local_50;
  SampledSpectrum local_40;
  undefined1 auVar17 [56];
  
  local_98.values.values[3] = local_98.values.values[1];
  local_98.values.values._0_12_ = ZEXT812(0);
  this_00 = &(this->super_LightBase).renderFromLight;
  PVar19 = Transform::operator()(this_00,(Point3<float> *)&local_98);
  local_58 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = in_register_00001208;
  local_78 = auVar5._0_16_;
  local_88._0_4_ = local_58;
  local_60 = vmovlps_avx(local_78);
  PVar20 = LightSampleContext::p(&ctx);
  auVar6._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = in_register_00001208;
  auVar3 = vsubps_avx(local_78,auVar6._0_16_);
  auVar11 = ZEXT856(auVar3._8_8_);
  auVar16 = (undefined1  [60])0x0;
  local_98.values.values._0_8_ = vmovlps_avx(auVar3);
  local_98.values.values[2] = (float)local_88._0_4_ - PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  VVar21 = Normalize<float>((Vector3<float> *)&local_98);
  auVar13._0_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._4_60_ = auVar16;
  auVar17 = auVar16._4_56_;
  auVar7._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  local_78 = auVar7._0_16_;
  local_88 = auVar13._0_16_;
  auVar18._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
  auVar18._8_4_ = auVar11._0_4_ ^ 0x80000000;
  auVar18._12_4_ = auVar11._4_4_ ^ 0x80000000;
  auVar3._0_8_ = CONCAT44(auVar16._0_4_,auVar13._0_4_) ^ 0x8000000080000000;
  auVar3._8_4_ = auVar16._4_4_ ^ 0x80000000;
  auVar3._12_4_ = auVar16._8_4_ ^ 0x80000000;
  auVar11 = ZEXT856(auVar3._8_8_);
  uVar1 = vmovlps_avx(auVar18);
  local_98.values.values[2] = -auVar13._0_4_;
  local_98.values.values[0] = (float)(int)uVar1;
  local_98.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  VVar21 = Transform::ApplyInverse<float>(this_00,(Vector3<float> *)&local_98);
  SVar22 = I(this,(Vector3f)VVar21.super_Tuple3<pbrt::Vector3,_float>,&lambda);
  auVar14._0_8_ = SVar22.values.values._8_8_;
  auVar14._8_56_ = auVar17;
  auVar8._0_8_ = SVar22.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar14._0_16_);
  auVar11 = ZEXT856(local_40.values.values._8_8_);
  PVar20 = LightSampleContext::p(&ctx);
  local_50.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  local_50._0_8_ = vmovlps_avx(auVar9._0_16_);
  a = DistanceSquared<float>
                ((pbrt *)&local_60,(Point3<float> *)&local_50,
                 (Point3<float> *)CONCAT44(extraout_var,extraout_EDX));
  auVar11 = extraout_var_00;
  SVar22 = SampledSpectrum::operator/(&local_40,a);
  auVar15._0_8_ = SVar22.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar10._0_8_ = SVar22.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  local_98.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
  bVar2 = SampledSpectrum::operator_cast_to_bool(&local_98);
  if (!bVar2) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_60;
    auVar12._4_4_ = local_58;
    auVar12._0_4_ = local_58;
    auVar12._8_4_ = local_58;
    auVar12._12_4_ = local_58;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    auVar3 = vshufps_avx(auVar4,auVar4,0x50);
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)local_98.values.values._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_98.values.values._8_8_
    ;
    uVar1 = vmovlps_avx(local_78);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_88._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar3;
    uVar1 = vmovlps_avx(auVar12);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  __return_storage_ptr__->set = bVar2;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> ProjectionLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                        SampledWavelengths lambda,
                                                        LightSamplingMode mode) const {
    // Return sample for incident radiance from _ProjectionLight_
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    Vector3f wl = renderFromLight.ApplyInverse(-wi);
    SampledSpectrum Li = I(wl, lambda) / DistanceSquared(p, ctx.p());
    if (!Li)
        return {};
    return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
}